

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O0

bool __thiscall
wallet::DescriptorScriptPubKeyMan::HasWalletDescriptor
          (DescriptorScriptPubKeyMan *this,WalletDescriptor *desc)

{
  long lVar1;
  bool bVar2;
  char *in_RSI;
  AnnotatedMixin<std::recursive_mutex> *in_RDI;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock75;
  AnnotatedMixin<std::recursive_mutex> *in_stack_ffffffffffffffa8;
  base_blob<256U> *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbc;
  undefined1 in_stack_ffffffffffffffbd;
  undefined1 in_stack_ffffffffffffffbe;
  undefined1 in_stack_ffffffffffffffbf;
  byte bVar3;
  undefined1 in_stack_ffffffffffffffcb;
  int in_stack_ffffffffffffffcc;
  char *in_stack_ffffffffffffffd0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>(in_stack_ffffffffffffffa8);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (in_stack_ffffffffffffffe8,in_RDI,in_RSI,in_stack_ffffffffffffffd0,
             in_stack_ffffffffffffffcc,(bool)in_stack_ffffffffffffffcb);
  bVar2 = base_blob<256U>::IsNull
                    ((base_blob<256U> *)
                     CONCAT17(in_stack_ffffffffffffffbf,
                              CONCAT16(in_stack_ffffffffffffffbe,
                                       CONCAT15(in_stack_ffffffffffffffbd,
                                                CONCAT14(in_stack_ffffffffffffffbc,
                                                         in_stack_ffffffffffffffb8)))));
  bVar3 = false;
  if (!bVar2) {
    bVar2 = base_blob<256U>::IsNull
                      ((base_blob<256U> *)
                       (ulong)CONCAT16(in_stack_ffffffffffffffbe,
                                       CONCAT15(in_stack_ffffffffffffffbd,
                                                CONCAT14(in_stack_ffffffffffffffbc,
                                                         in_stack_ffffffffffffffb8))));
    bVar3 = false;
    if (!bVar2) {
      bVar3 = ::operator==((base_blob<256U> *)
                           (ulong)CONCAT16(bVar2,CONCAT15(in_stack_ffffffffffffffbd,
                                                          CONCAT14(in_stack_ffffffffffffffbc,
                                                                   in_stack_ffffffffffffffb8))),
                           in_stack_ffffffffffffffb0);
    }
  }
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffffa8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (bool)(bVar3 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool DescriptorScriptPubKeyMan::HasWalletDescriptor(const WalletDescriptor& desc) const
{
    LOCK(cs_desc_man);
    return !m_wallet_descriptor.id.IsNull() && !desc.id.IsNull() && m_wallet_descriptor.id == desc.id;
}